

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

void __thiscall
Js::Type::ExtractSnapType(Type *this,SnapType *sType,SnapHandler *optHandler,SlabAllocator *alloc)

{
  bool bVar1;
  
  sType->TypePtrId = (TTD_PTR_ID)this;
  sType->JsTypeId = this->typeId;
  sType->PrototypeVar = (this->prototype).ptr;
  sType->ScriptContextLogId =
       ((((this->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
       ScriptContextLogTag;
  sType->TypeHandlerInfo = optHandler;
  sType->HasNoEnumerableProperties = false;
  bVar1 = DynamicType::Is(this);
  if (bVar1) {
    sType->HasNoEnumerableProperties = *(bool *)((long)&this[1].javascriptLibrary.ptr + 2);
  }
  return;
}

Assistant:

void Type::ExtractSnapType(TTD::NSSnapType::SnapType* sType, TTD::NSSnapType::SnapHandler* optHandler, TTD::SlabAllocator& alloc) const
    {
        sType->TypePtrId = TTD_CONVERT_TYPEINFO_TO_PTR_ID(this);
        sType->JsTypeId = this->GetTypeId();

        sType->PrototypeVar = this->GetPrototype();

        sType->ScriptContextLogId = this->GetScriptContext()->ScriptContextLogTag;
        sType->TypeHandlerInfo = optHandler;

        sType->HasNoEnumerableProperties = false;
        if(Js::DynamicType::Is(this))
        {
            sType->HasNoEnumerableProperties = static_cast<const Js::DynamicType*>(this)->GetHasNoEnumerableProperties();
        }
    }